

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

Vec<Hpipe::BranchSet::Range> * __thiscall
Hpipe::Vec<Hpipe::BranchSet::Range>::from
          (Vec<Hpipe::BranchSet::Range> *__return_storage_ptr__,Vec<Hpipe::BranchSet::Range> *this,
          uint beg)

{
  pointer pRVar1;
  
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>).
  super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::reserve
            (&__return_storage_ptr__->
              super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>,
             ((long)(this->
                    super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
                    .
                    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
                    .
                    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) - (ulong)beg);
  while( true ) {
    pRVar1 = (this->super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
             .super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->
                      super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                      ).
                      super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 5) <= (ulong)beg)
    break;
    std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>::
    emplace_back<Hpipe::BranchSet::Range_const&>
              ((vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>> *)
               __return_storage_ptr__,pRVar1 + beg);
    beg = beg + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Vec      from                 ( unsigned beg               ) const { Vec res; res.reserve( this->size() - beg ); for( unsigned i = beg; i < this->size(); ++i ) res << this->operator[]( i ); return res; }